

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Scroll.cxx
# Opt level: O1

void __thiscall Fl_Scroll::resize(Fl_Scroll *this,int X,int Y,int W,int H)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  Fl_Widget *pFVar7;
  uint uVar8;
  Fl_Widget **ppFVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  uint uVar14;
  
  iVar10 = (this->super_Fl_Group).super_Fl_Widget.x_;
  iVar1 = (this->super_Fl_Group).super_Fl_Widget.y_;
  iVar2 = (this->super_Fl_Group).super_Fl_Widget.w_;
  iVar3 = (this->super_Fl_Group).super_Fl_Widget.h_;
  Fl_Widget::resize((Fl_Widget *)this,X,Y,W,H);
  fix_scrollbar_order(this);
  ppFVar9 = Fl_Group::array(&this->super_Fl_Group);
  iVar4 = (this->super_Fl_Group).children_;
  if (iVar4 != 2) {
    lVar12 = 0;
    do {
      pFVar7 = ppFVar9[lVar12];
      (*pFVar7->_vptr_Fl_Widget[4])
                (pFVar7,(ulong)(uint)(pFVar7->x_ + (X - iVar10)),
                 (ulong)(uint)(pFVar7->y_ + (Y - iVar1)),(ulong)(uint)pFVar7->w_,
                 (ulong)(uint)pFVar7->h_);
      lVar12 = lVar12 + 1;
    } while (iVar4 + -2 != (int)lVar12);
  }
  if ((iVar2 == W) && (iVar3 == H)) {
    uVar11 = (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_ |
             (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.flags_;
    uVar5 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.label_.align_;
    uVar14 = uVar5 & 4;
    uVar6 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.w_;
    uVar8 = (W + X) - uVar6;
    if (uVar14 != 0) {
      uVar8 = X;
    }
    uVar13 = 0;
    iVar10 = 0;
    if ((uVar11 & 2) == 0) {
      iVar10 = (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.h_;
    }
    if ((uVar5 & 1) == 0) {
      iVar10 = 0;
    }
    (*(this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[4])
              (&this->scrollbar,(ulong)uVar8,(ulong)(uint)(iVar10 + Y),(ulong)uVar6,
               (ulong)(uint)(this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.h_);
    if ((uVar11 & 2) == 0) {
      uVar13 = (this->scrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.w_;
    }
    if (uVar14 == 0) {
      uVar13 = uVar14 >> 2;
    }
    uVar6 = (H + Y) - (this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.h_;
    if ((uVar5 & 1) != 0) {
      uVar6 = Y;
    }
    (*(this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget._vptr_Fl_Widget[4])
              (&this->hscrollbar,(ulong)(uVar13 + X),(ulong)uVar6,
               (ulong)(uint)(this->hscrollbar).super_Fl_Slider.super_Fl_Valuator.super_Fl_Widget.w_)
    ;
    return;
  }
  Fl_Widget::redraw((Fl_Widget *)this);
  return;
}

Assistant:

void Fl_Scroll::resize(int X, int Y, int W, int H) {
  int dx = X-x(), dy = Y-y();
  int dw = W-w(), dh = H-h();
  Fl_Widget::resize(X,Y,W,H); // resize _before_ moving children around
  fix_scrollbar_order();
  // move all the children:
  Fl_Widget*const* a = array();
  for (int i=children()-2; i--;) {
    Fl_Widget* o = *a++;
    o->position(o->x()+dx, o->y()+dy);
  }
  if (dw==0 && dh==0) {
    char pad = ( scrollbar.visible() && hscrollbar.visible() );
    char al = ( (scrollbar.align() & FL_ALIGN_LEFT) != 0 );
    char at = ( (scrollbar.align() & FL_ALIGN_TOP)  !=0 );
    scrollbar.position(al?X:X+W-scrollbar.w(), (at&&pad)?Y+hscrollbar.h():Y);
    hscrollbar.position((al&&pad)?X+scrollbar.w():X, at?Y:Y+H-hscrollbar.h());
  } else {
    // FIXME recalculation of scrollbars needs to be moved out of "draw()" (STR #1895)
    redraw(); // need full recalculation of scrollbars
  }
}